

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O2

int binbuf_write(_binbuf *x,char *filename,char *dir,int crflag)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  FILE *__s;
  long lVar5;
  t_atomtype tVar6;
  t_atom *a;
  char *buf;
  bool bVar7;
  _binbuf *local_1430;
  char fbuf [1000];
  char sbuf [4096];
  undefined1 local_38 [8];
  
  if (*dir == '\0') {
    snprintf(fbuf,999,"%s",filename);
  }
  else {
    snprintf(fbuf,999,"%s/%s",dir,filename);
  }
  fbuf[999] = '\0';
  sVar4 = strlen(filename);
  iVar3 = strcmp(filename + (sVar4 - 4),".pat");
  if ((iVar3 == 0) || (iVar3 = strcmp(filename + (sVar4 - 4),".mxt"), iVar3 == 0)) {
    x = binbuf_convert(x,0);
    local_1430 = x;
  }
  else {
    local_1430 = (_binbuf *)0x0;
  }
  __s = (FILE *)sys_fopen(fbuf,"w");
  if (__s != (FILE *)0x0) {
    a = x->b_vec;
    iVar3 = x->b_n;
    buf = sbuf;
    while (bVar7 = iVar3 != 0, iVar3 = iVar3 + -1, bVar7) {
      tVar6 = a->a_type;
      if ((tVar6 == A_DOLLSYM) || (lVar5 = 0x28, tVar6 == A_SYMBOL)) {
        sVar4 = strlen(((a->a_w).w_symbol)->s_name);
        lVar5 = (long)((int)sVar4 + 0x50);
      }
      if ((long)(local_38 + -(long)buf) < lVar5) {
        sVar4 = fwrite(sbuf,(long)buf - (long)sbuf,1,__s);
        if (sVar4 == 0) goto LAB_001637a8;
        tVar6 = a->a_type;
        buf = sbuf;
      }
      if (tVar6 == A_SEMI) {
        if (sbuf < buf) goto LAB_00163708;
        cVar2 = '\n';
        if (crflag == 0) goto LAB_00163723;
      }
      else {
        if ((tVar6 == A_COMMA) && (sbuf < buf)) {
LAB_00163708:
          pcVar1 = buf + -1;
          if (buf[-1] != ' ') {
            pcVar1 = buf;
          }
          buf = pcVar1;
          if ((crflag != 0) && (cVar2 = '\n', tVar6 == A_SEMI)) goto LAB_00163759;
        }
LAB_00163723:
        atom_string(a,buf,((int)local_38 - (int)buf) - 2);
        sVar4 = strlen(buf);
        buf = buf + (int)sVar4;
        cVar2 = ' ';
        if (a->a_type == A_SEMI) {
          cVar2 = '\n';
        }
      }
LAB_00163759:
      *buf = cVar2;
      buf = buf + 1;
      a = a + 1;
    }
    sVar4 = fwrite(sbuf,(long)buf - (long)sbuf,1,__s);
    if ((sVar4 != 0) && (iVar3 = fflush(__s), iVar3 == 0)) {
      iVar3 = 0;
      if (local_1430 != (_binbuf *)0x0) {
        binbuf_free(local_1430);
      }
      goto LAB_001637c4;
    }
  }
LAB_001637a8:
  if (local_1430 != (_binbuf *)0x0) {
    binbuf_free(local_1430);
  }
  iVar3 = 1;
  if (__s == (FILE *)0x0) {
    return 1;
  }
LAB_001637c4:
  fclose(__s);
  return iVar3;
}

Assistant:

int binbuf_write(const t_binbuf *x, const char *filename, const char *dir, int crflag)
{
    FILE *f = 0;
    char sbuf[WBUFSIZE], fbuf[MAXPDSTRING], *bp = sbuf, *ep = sbuf + WBUFSIZE;
    t_atom *ap;
    t_binbuf *y = 0;
    const t_binbuf *z = x;
    int indx;

    if (*dir)
        snprintf(fbuf, MAXPDSTRING-1, "%s/%s", dir, filename);
    else
        snprintf(fbuf, MAXPDSTRING-1, "%s", filename);
    fbuf[MAXPDSTRING-1] = 0;

    if (!strcmp(filename + strlen(filename) - 4, ".pat") ||
        !strcmp(filename + strlen(filename) - 4, ".mxt"))
    {
        y = binbuf_convert(x, 0);
        z = y;
    }

    if (!(f = sys_fopen(fbuf, "w")))
        goto fail;
    for (ap = z->b_vec, indx = z->b_n; indx--; ap++)
    {
        int length;
            /* estimate how many characters will be needed.  Printing out
            symbols may need extra characters for inserting backslashes. */
        if (ap->a_type == A_SYMBOL || ap->a_type == A_DOLLSYM)
            length = 80 + (int)strlen(ap->a_w.w_symbol->s_name);
        else length = 40;
        if (ep - bp < length)
        {
            if (fwrite(sbuf, bp-sbuf, 1, f) < 1)
                goto fail;
            bp = sbuf;
        }
        if ((ap->a_type == A_SEMI || ap->a_type == A_COMMA) &&
            bp > sbuf && bp[-1] == ' ') bp--;
        if (!crflag || ap->a_type != A_SEMI)
        {
            atom_string(ap, bp, (unsigned int)((ep-bp)-2));
            length = (int)strlen(bp);
            bp += length;
        }
        if (ap->a_type == A_SEMI)
        {
            *bp++ = '\n';
        }
        else
        {
            *bp++ = ' ';
        }
    }
    if (fwrite(sbuf, bp-sbuf, 1, f) < 1)
        goto fail;

    if (fflush(f) != 0)
        goto fail;

    if (y)
        binbuf_free(y);
    fclose(f);
    return (0);
fail:
    if (y)
        binbuf_free(y);
    if (f)
        fclose(f);
    return (1);
}